

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

Gia_Man_t *
Gia_ManFindExact(word *pTruth,int nVars,int nFunc,int nMaxDepth,int *pArrTimeProfile,int nBTLimit,
                int nStartGates,int fVerbose)

{
  abctime aVar1;
  Ses_Man_t *pSes_00;
  char *pSol_00;
  abctime aVar2;
  abctime timeStart;
  Gia_Man_t *pGia;
  char *pSol;
  Ses_Man_t *pSes;
  int nBTLimit_local;
  int *pArrTimeProfile_local;
  int nMaxDepth_local;
  int nFunc_local;
  int nVars_local;
  word *pTruth_local;
  
  timeStart = 0;
  if ((1 < nVars) && (nVars < 9)) {
    aVar1 = Abc_Clock();
    pSes_00 = Ses_ManAlloc(pTruth,nVars,nFunc,nMaxDepth,pArrTimeProfile,1,nBTLimit,fVerbose);
    pSes_00->nStartGates = nStartGates;
    pSes_00->fVeryVerbose = 1;
    pSes_00->fExtractVerbose = 0;
    pSes_00->fSatVerbose = 0;
    pSes_00->fReasonVerbose = 1;
    if (fVerbose != 0) {
      Ses_ManPrintFuncs(pSes_00);
    }
    pSol_00 = Ses_ManFindMinimumSize(pSes_00);
    if ((pSol_00 != (char *)0x0) &&
       (timeStart = (abctime)Ses_ManExtractGia(pSol_00), pSol_00 != (char *)0x0)) {
      free(pSol_00);
    }
    aVar2 = Abc_Clock();
    pSes_00->timeTotal = aVar2 - aVar1;
    if (fVerbose != 0) {
      Ses_ManPrintRuntime(pSes_00);
    }
    Ses_ManClean(pSes_00);
    return (Gia_Man_t *)timeStart;
  }
  __assert_fail("nVars >= 2 && nVars <= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                ,0x99a,"Gia_Man_t *Gia_ManFindExact(word *, int, int, int, int *, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManFindExact( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrTimeProfile, int nBTLimit, int nStartGates, int fVerbose )
{
    Ses_Man_t * pSes;
    char * pSol;
    Gia_Man_t * pGia = NULL;
    abctime timeStart;

    /* some checks */
    assert( nVars >= 2 && nVars <= 8 );

    timeStart = Abc_Clock();

    pSes = Ses_ManAlloc( pTruth, nVars, nFunc, nMaxDepth, pArrTimeProfile, 1, nBTLimit, fVerbose );
    pSes->nStartGates = nStartGates;
    pSes->fVeryVerbose = 1;
    pSes->fExtractVerbose = 0;
    pSes->fSatVerbose = 0;
    pSes->fReasonVerbose = 1;
    if ( fVerbose )
        Ses_ManPrintFuncs( pSes );

    if ( ( pSol = Ses_ManFindMinimumSize( pSes ) ) != NULL )
    {
        pGia = Ses_ManExtractGia( pSol );
        ABC_FREE( pSol );
    }

    pSes->timeTotal = Abc_Clock() - timeStart;

    if ( fVerbose )
        Ses_ManPrintRuntime( pSes );

    /* cleanup */
    Ses_ManClean( pSes );

    return pGia;
}